

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11.c
# Opt level: O3

void platform_get_x11_auth(X11Display *disp,Conf *conf)

{
  char *pcVar1;
  
  pcVar1 = getenv("XAUTHORITY");
  if (pcVar1 != (char *)0x0) {
    x11_get_auth_from_authfile(disp,pcVar1);
    return;
  }
  pcVar1 = getenv("HOME");
  if (pcVar1 != (char *)0x0) {
    pcVar1 = dupcat_fn(pcVar1,"/.Xauthority",0);
    if (pcVar1 != (char *)0x0) {
      x11_get_auth_from_authfile(disp,pcVar1);
      safefree(pcVar1);
      return;
    }
  }
  return;
}

Assistant:

void platform_get_x11_auth(struct X11Display *disp, Conf *conf)
{
    char *xauthfile;
    bool needs_free;

    /*
     * Find the .Xauthority file.
     */
    needs_free = false;
    xauthfile = getenv("XAUTHORITY");
    if (!xauthfile) {
        xauthfile = getenv("HOME");
        if (xauthfile) {
            xauthfile = dupcat(xauthfile, "/.Xauthority");
            needs_free = true;
        }
    }

    if (xauthfile) {
        x11_get_auth_from_authfile(disp, xauthfile);
        if (needs_free)
            sfree(xauthfile);
    }
}